

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O0

void cancel_method_proc(Am_Object *param_1)

{
  Am_Value local_28;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *param_0_local;
  
  local_10 = param_1;
  Am_Object::Am_Object(&local_18,(Am_Object *)&pop_up_window);
  Am_Value::Am_Value(&local_28,(Am_Value *)&Am_No_Value);
  Am_Finish_Pop_Up_Waiting((Am_Object *)&local_18,(Am_Value *)&local_28);
  Am_Value::~Am_Value(&local_28);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, cancel_method,
		 (Am_Object /* cmd */)) {
  Am_Finish_Pop_Up_Waiting(pop_up_window, Am_No_Value);
}